

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

void setarray(context *ctx,lua_State *L,int index,int key)

{
  table *ptVar1;
  undefined4 in_register_0000000c;
  node n;
  value local_30 [2];
  uint8_t local_1b;
  
  setvalue(ctx,L,(int)local_30,(node *)CONCAT44(in_register_0000000c,key));
  ptVar1 = ctx->tbl;
  ptVar1->arraytype[(long)index + -1] = local_1b;
  ptVar1->array[(long)index + -1] = local_30[0];
  return;
}

Assistant:

static void
setarray(struct context *ctx, lua_State *L, int index, int key) {
	struct node n;
	setvalue(ctx, L, index, &n);
	struct table *tbl = ctx->tbl;
	--key;	// base 0
	tbl->arraytype[key] = n.valuetype;
	tbl->array[key] = n.v;
}